

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int64_t expand(archive_read *a,int64_t end)

{
  byte bVar1;
  rar *rar;
  void *pvVar2;
  rar_program_code *prVar3;
  long *plVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint8_t *puVar13;
  rar_program_code **pprVar14;
  byte *buf;
  rar_program_code *prog;
  uLong uVar15;
  undefined8 *puVar16;
  void *pvVar17;
  int iVar18;
  long lVar19;
  rar_program_code **pprVar20;
  long *plVar21;
  uint uVar22;
  huffman_code *code;
  size_t __size;
  ulong uVar23;
  size_t sVar24;
  uint8_t *__size_00;
  bool bVar25;
  byte local_11a;
  uint8_t flags;
  long local_118;
  uint32_t local_10c;
  uint8_t *local_108;
  rar_br *local_100;
  ulong local_f8;
  huffman_code *local_f0;
  undefined8 local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  uint32_t uStack_d8;
  uint32_t uStack_d4;
  undefined8 uStack_d0;
  long local_c0;
  uint8_t *local_b8;
  void *local_b0;
  memory_bit_reader local_a8;
  rar_program_code **local_80;
  void *local_78;
  huffman_code *local_70;
  huffman_code *local_68;
  huffman_code *local_60;
  memory_bit_reader local_58;
  
  rar = (rar *)a->format->data;
  lVar19 = (rar->filters).filterstart;
  if (lVar19 < end) {
    end = lVar19;
  }
  local_100 = &rar->br;
  code = &rar->maincode;
  local_68 = &rar->offsetcode;
  local_70 = &rar->lowoffsetcode;
  local_60 = &rar->lengthcode;
  local_118 = end;
  local_f0 = code;
LAB_0014807d:
  while( true ) {
    while( true ) {
      lVar19 = (rar->lzss).position;
      if (end <= lVar19) {
        return end;
      }
      if (rar->is_ppmd_block != '\0') {
        return lVar19;
      }
      uVar6 = read_next_symbol(a,code);
      if ((int)uVar6 < 0) {
        return -0x1e;
      }
      if (0xff < uVar6) break;
      lzss_emit_literal(rar,(uint8_t)uVar6);
    }
    if (uVar6 != 0x100) break;
    iVar18 = (rar->br).cache_avail;
    if (iVar18 < 1) {
      iVar8 = rar_br_fillup(a,local_100);
      iVar18 = (rar->br).cache_avail;
      if (iVar18 < 1 && iVar8 == 0) goto LAB_00148b7f;
    }
    uVar6 = iVar18 - 1;
    (rar->br).cache_avail = uVar6;
    if (((rar->br).cache_buffer >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
      rar->start_new_block = '\x01';
      if (iVar18 < 2) {
        iVar18 = rar_br_fillup(a,local_100);
        uVar6 = (rar->br).cache_avail;
        if ((int)uVar6 < 1 && iVar18 == 0) goto LAB_00148b7f;
      }
      rar->start_new_table = ((rar->br).cache_buffer >> ((ulong)(uVar6 - 1) & 0x3f) & 1) != 0;
      (rar->br).cache_avail = uVar6 - 1;
      return (rar->lzss).position;
    }
    iVar18 = parse_codes(a);
    code = local_f0;
    end = local_118;
    if (iVar18 != 0) {
      return -0x1e;
    }
  }
  if (uVar6 == 0x102) {
    uVar6 = rar->lastlength;
    if (uVar6 == 0) goto LAB_0014807d;
    uVar22 = rar->lastoffset;
  }
  else {
    if (uVar6 == 0x101) {
      pvVar17 = a->format->data;
      iVar18 = rar_decode_byte(a,&flags);
      if (iVar18 == 0) {
        return -0x1e;
      }
      local_f8 = (ulong)flags;
      __size = (ulong)(flags & 7) + 1;
      if (__size == 7) {
        iVar18 = rar_decode_byte(a,&local_11a);
        if (iVar18 == 0) {
          return -0x1e;
        }
        __size = (ulong)local_11a + 7;
      }
      else if ((char)__size == '\b') {
        iVar18 = rar_decode_byte(a,&local_11a);
        bVar5 = local_11a;
        if (iVar18 == 0) {
          return -0x1e;
        }
        iVar18 = rar_decode_byte(a,&local_11a);
        if (iVar18 == 0) {
          return -0x1e;
        }
        __size = (size_t)CONCAT11(bVar5,local_11a);
      }
      puVar13 = (uint8_t *)malloc(__size);
      if (puVar13 == (uint8_t *)0x0) {
        return -0x1e;
      }
      sVar24 = 0;
      while (__size != sVar24) {
        iVar18 = rar_decode_byte(a,puVar13 + sVar24);
        sVar24 = sVar24 + 1;
        if (iVar18 == 0) goto LAB_00148bb1;
      }
      pvVar2 = a->format->data;
      local_a8.available = 0;
      local_a8.at_eof = 0;
      local_a8.offset = 0;
      local_a8.bits = 0;
      uStack_d8 = 0;
      uStack_d4 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      uStack_dc = 0;
      uVar6 = 0;
      pprVar20 = (rar_program_code **)((long)pvVar2 + 0x398);
      for (pprVar14 = pprVar20; *pprVar14 != (rar_program_code *)0x0; pprVar14 = &(*pprVar14)->next)
      {
        uVar6 = uVar6 + 1;
      }
      pprVar14 = pprVar20;
      local_b8 = puVar13;
      local_b0 = pvVar2;
      local_a8.bytes = puVar13;
      local_a8.length = __size;
      local_78 = pvVar17;
      if ((char)local_f8 < '\0') {
        uVar11 = membr_next_rarvm_number(&local_a8);
        if (uVar11 == 0) {
          delete_filter(*(rar_filter **)((long)pvVar2 + 0x3a0));
          *(undefined8 *)((long)pvVar2 + 0x3a0) = 0;
          delete_program_code(*(rar_program_code **)((long)pvVar2 + 0x398));
          *(undefined8 *)((long)pvVar2 + 0x398) = 0;
          uVar22 = 0;
        }
        else {
          uVar22 = uVar11 - 1;
          puVar13 = local_b8;
          if (uVar6 < uVar22) goto LAB_00148bb1;
        }
        *(uint *)((long)local_b0 + 0x3b0) = uVar22;
      }
      else {
        uVar22 = *(uint *)((long)pvVar2 + 0x3b0);
      }
      while( true ) {
        pvVar17 = local_b0;
        uVar23 = local_f8;
        prog = *pprVar14;
        bVar25 = uVar22 == 0;
        uVar22 = uVar22 - 1;
        if (bVar25) break;
        pprVar14 = &prog->next;
      }
      if (prog != (rar_program_code *)0x0) {
        prog->usagecount = prog->usagecount + 1;
      }
      local_80 = pprVar20;
      uVar11 = membr_next_rarvm_number(&local_a8);
      local_c0 = *(long *)((long)pvVar17 + 0x360) + 0x102;
      if ((uVar23 & 0x40) == 0) {
        local_c0 = *(long *)((long)pvVar17 + 0x360);
      }
      local_c0 = local_c0 + (ulong)uVar11;
      if ((uVar23 & 0x20) == 0) {
        if (prog == (rar_program_code *)0x0) {
          uStack_d8 = 0;
          goto LAB_00148789;
        }
        uStack_d8 = prog->oldfilterlength;
LAB_00148773:
        uStack_d4 = prog->usagecount;
      }
      else {
        uStack_d8 = membr_next_rarvm_number(&local_a8);
        if (prog != (rar_program_code *)0x0) goto LAB_00148773;
LAB_00148789:
        uStack_d4 = 0;
      }
      uStack_dc = 0x3c000;
      uStack_d0 = CONCAT44(0x40000,(undefined4)uStack_d0);
      local_10c = uStack_d8;
      if ((uVar23 & 0x10) != 0) {
        uVar11 = membr_bits(&local_a8,7);
        for (lVar19 = 0; lVar19 != 7; lVar19 = lVar19 + 1) {
          if ((uVar11 >> ((uint)lVar19 & 0x1f) & 1) != 0) {
            uVar12 = membr_next_rarvm_number(&local_a8);
            *(uint32_t *)((long)&local_e8 + lVar19 * 4) = uVar12;
          }
        }
      }
      end = local_118;
      if (prog == (rar_program_code *)0x0) {
        uVar11 = membr_next_rarvm_number(&local_a8);
        __size_00 = (uint8_t *)(ulong)uVar11;
        puVar13 = local_b8;
        if ((uVar11 - 0x10001 < 0xffff0000) ||
           (buf = (byte *)malloc((size_t)__size_00), puVar13 = local_b8, buf == (byte *)0x0))
        goto LAB_00148bb1;
        local_108 = __size_00;
        for (puVar13 = (uint8_t *)0x0; end = local_118, __size_00 != puVar13; puVar13 = puVar13 + 1)
        {
          uVar11 = membr_bits(&local_a8,8);
          buf[(long)puVar13] = (byte)uVar11;
        }
        local_58.bits = 0;
        local_58.available = 0;
        local_58.at_eof = 0;
        bVar5 = 0;
        for (puVar13 = (uint8_t *)0x1; __size_00 != puVar13; puVar13 = puVar13 + 1) {
          bVar5 = bVar5 ^ buf[(long)puVar13];
        }
        if (((int)local_108 != 0) && (bVar5 == *buf)) {
          local_58.offset = 1;
          local_58.bytes = buf;
          local_58.length = (size_t)__size_00;
          prog = (rar_program_code *)calloc(1,0x38);
          if (prog != (rar_program_code *)0x0) {
            uVar15 = cm_zlib_z_crc32(0,buf,(uInt)local_108);
            prog->fingerprint = (long)__size_00 << 0x20 | uVar15;
            uVar11 = membr_bits(&local_58,1);
            if (uVar11 != 0) {
              uVar11 = membr_next_rarvm_number(&local_58);
              uVar6 = uVar11 + 1;
              prog->staticdatalen = uVar6;
              local_108 = (uint8_t *)malloc((ulong)uVar6);
              prog->staticdata = local_108;
              if (local_108 == (uint8_t *)0x0) {
                delete_program_code(prog);
                goto LAB_00148ba4;
              }
              for (uVar23 = 0; end = local_118, uVar6 != uVar23; uVar23 = uVar23 + 1) {
                uVar11 = membr_bits(&local_58,8);
                local_108[uVar23] = (uint8_t)uVar11;
              }
            }
            free(buf);
            pprVar14 = local_80;
            do {
              pprVar20 = pprVar14;
              prVar3 = *pprVar20;
              pprVar14 = &prVar3->next;
            } while (prVar3 != (rar_program_code *)0x0);
            *pprVar20 = prog;
            uVar23 = local_f8;
            goto LAB_00148967;
          }
        }
      }
      else {
LAB_00148967:
        prog->oldfilterlength = local_10c;
        if ((uVar23 & 8) == 0) {
          local_108 = (uint8_t *)0x0;
          buf = (byte *)0x0;
        }
        else {
          uVar11 = membr_next_rarvm_number(&local_a8);
          puVar13 = local_b8;
          if (0x1fc0 < uVar11) goto LAB_00148bb1;
          buf = (byte *)malloc((ulong)(uVar11 + 0x40));
          puVar13 = local_b8;
          if (buf == (byte *)0x0) goto LAB_00148bb1;
          local_108 = (uint8_t *)(ulong)uVar11;
          for (uVar23 = 0; end = local_118, uVar11 != uVar23; uVar23 = uVar23 + 1) {
            uVar12 = membr_bits(&local_a8,8);
            buf[uVar23 + 0x40] = (byte)uVar12;
          }
        }
        if (local_a8.at_eof == 0) {
          puVar16 = (undefined8 *)calloc(1,0x58);
          if (puVar16 == (undefined8 *)0x0) {
LAB_00148a65:
            puVar16 = (undefined8 *)0x0;
          }
          else {
            *puVar16 = prog;
            puVar13 = (uint8_t *)0x40;
            if (0x40 < (uint)local_108) {
              puVar13 = local_108;
            }
            *(int *)(puVar16 + 6) = (int)puVar13;
            pvVar17 = calloc(1,(ulong)puVar13 & 0xffffffff);
            puVar16[5] = pvVar17;
            if (pvVar17 == (void *)0x0) goto LAB_00148a65;
            if (buf != (byte *)0x0) {
              memcpy(pvVar17,buf,(ulong)local_108 & 0xffffffff);
            }
            puVar16[3] = CONCAT44(uStack_d4,uStack_d8);
            puVar16[4] = uStack_d0;
            puVar16[1] = local_e8;
            puVar16[2] = CONCAT44(uStack_dc,uStack_e0);
            puVar16[7] = local_c0;
            *(uint32_t *)(puVar16 + 8) = local_10c;
          }
          free(buf);
          code = local_f0;
          puVar13 = local_b8;
          if (puVar16 == (undefined8 *)0x0) goto LAB_00148bb1;
          for (lVar19 = 0; lVar19 != 7; lVar19 = lVar19 + 1) {
            *(undefined4 *)(puVar16[5] + lVar19 * 4) = *(undefined4 *)((long)&local_e8 + lVar19 * 4)
            ;
          }
          *(uint32_t *)(puVar16[5] + 0x1c) = local_10c;
          *(undefined4 *)(puVar16[5] + 0x20) = 0;
          *(uint32_t *)(puVar16[5] + 0x2c) = prog->usagecount;
          plVar4 = (long *)((long)local_b0 + 0x3a0);
          do {
            plVar21 = plVar4;
            lVar19 = *plVar21;
            plVar4 = (long *)(lVar19 + 0x50);
          } while (lVar19 != 0);
          *plVar21 = (long)puVar16;
          if (*(long *)(*(long *)((long)local_b0 + 0x3a0) + 0x50) == 0) {
            *(long *)((long)local_b0 + 0x3a8) = local_c0;
          }
          free(local_b8);
          lVar19 = *(long *)((long)local_78 + 0x3a8);
          local_118 = end;
          if (lVar19 < end) {
            end = lVar19;
            local_118 = lVar19;
          }
          goto LAB_0014807d;
        }
      }
LAB_00148ba4:
      free(buf);
      puVar13 = local_b8;
LAB_00148bb1:
      free(puVar13);
      return -0x1e;
    }
    if (uVar6 < 0x107) {
      uVar23 = (ulong)(uVar6 - 0x103);
      uVar22 = rar->oldoffset[uVar23];
      uVar7 = read_next_symbol(a,local_60);
      if (0x1c < uVar7) goto LAB_00148b13;
      uVar6 = ""[uVar7] + 2;
      if (7 < uVar7) {
        bVar5 = ""[uVar7];
        iVar18 = (rar->br).cache_avail;
        if (iVar18 < (int)(uint)bVar5) {
          iVar8 = rar_br_fillup(a,local_100);
          iVar18 = (rar->br).cache_avail;
          if ((iVar8 == 0) && (iVar18 < (int)(uint)bVar5)) goto LAB_00148b7f;
        }
        iVar18 = iVar18 - (uint)bVar5;
        uVar6 = ((uint)((rar->br).cache_buffer >> ((byte)iVar18 & 0x3f)) & cache_masks[bVar5]) +
                uVar6;
        (rar->br).cache_avail = iVar18;
        end = local_118;
      }
      for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
        rar->oldoffset[uVar23] = rar->oldoffset[uVar23 - 1];
      }
    }
    else {
      if (uVar6 < 0x10f) {
        bVar5 = ""[uVar6 - 0x107];
        bVar1 = "\x02\x02\x03\x04\x05\x06\x06\x06"[uVar6 - 0x107];
        iVar18 = (rar->br).cache_avail;
        if (iVar18 < (int)(uint)bVar1) {
          iVar8 = rar_br_fillup(a,local_100);
          iVar18 = (rar->br).cache_avail;
          if ((iVar8 == 0) && (iVar18 < (int)(uint)bVar1)) goto LAB_00148b7f;
        }
        uVar23 = (rar->br).cache_buffer;
        iVar18 = iVar18 - (uint)bVar1;
        uVar6 = cache_masks[bVar1];
        (rar->br).cache_avail = iVar18;
        for (lVar19 = 0; lVar19 != -3; lVar19 = lVar19 + -1) {
          rar->oldoffset[lVar19 + 3] = rar->oldoffset[lVar19 + 2];
        }
        uVar22 = bVar5 + 1 + ((uint)(uVar23 >> ((byte)iVar18 & 0x3f)) & uVar6);
        rar->oldoffset[0] = uVar22;
        uVar6 = 2;
        end = local_118;
        goto LAB_001484cc;
      }
      if (299 < uVar6) {
LAB_00148b13:
        archive_set_error(&a->archive,0x54,"Bad RAR file data");
        return -0x1e;
      }
      uVar6 = uVar6 - 0x10f;
      iVar18 = ""[uVar6] + 3;
      if (7 < uVar6) {
        bVar5 = ""[uVar6];
        iVar8 = (rar->br).cache_avail;
        if (iVar8 < (int)(uint)bVar5) {
          iVar9 = rar_br_fillup(a,local_100);
          iVar8 = (rar->br).cache_avail;
          if ((iVar9 == 0) && (iVar8 < (int)(uint)bVar5)) goto LAB_00148b7f;
        }
        iVar8 = iVar8 - (uint)bVar5;
        iVar18 = ((uint)((rar->br).cache_buffer >> ((byte)iVar8 & 0x3f)) & cache_masks[bVar5]) +
                 iVar18;
        (rar->br).cache_avail = iVar8;
        end = local_118;
      }
      uVar6 = read_next_symbol(a,local_68);
      if (0x3c < uVar6) goto LAB_00148b13;
      uVar23 = (ulong)uVar6;
      uVar22 = expand::offsetbases[uVar23] + 1;
      if (3 < uVar6) {
        bVar5 = ""[uVar23];
        if (uVar6 < 10) {
          iVar8 = (rar->br).cache_avail;
          if (iVar8 < (int)(uint)bVar5) {
            iVar9 = rar_br_fillup(a,local_100);
            iVar8 = (rar->br).cache_avail;
            if ((iVar9 == 0) && (iVar8 < (int)(uint)bVar5)) {
LAB_00148b7f:
              archive_set_error(&a->archive,0x54,"Truncated RAR file data");
              rar->valid = '\0';
              return -0x1e;
            }
          }
          iVar8 = iVar8 - (uint)bVar5;
          uVar22 = ((uint)((rar->br).cache_buffer >> ((byte)iVar8 & 0x3f)) & cache_masks[bVar5]) +
                   uVar22;
          (rar->br).cache_avail = iVar8;
          end = local_118;
        }
        else {
          if (uVar23 - 0xc < 0x30) {
            iVar8 = (rar->br).cache_avail;
            iVar9 = bVar5 - 4;
            if (iVar8 < iVar9) {
              iVar10 = rar_br_fillup(a,local_100);
              iVar8 = (rar->br).cache_avail;
              if ((iVar10 == 0) && (iVar8 < iVar9)) goto LAB_00148b7f;
            }
            uVar22 = ((uint)((rar->br).cache_buffer >> ((byte)(iVar8 - iVar9) & 0x3f)) &
                     *(uint *)("" + (ulong)bVar5 * 4 + 1)) * 0x10 + uVar22;
            (rar->br).cache_avail = iVar8 - iVar9;
          }
          if (rar->numlowoffsetrepeats == 0) {
            uVar6 = read_next_symbol(a,local_70);
            if ((int)uVar6 < 0) {
              return -0x1e;
            }
            end = local_118;
            if (uVar6 == 0x10) {
              rar->numlowoffsetrepeats = 0xf;
              uVar22 = uVar22 + rar->lastlowoffset;
            }
            else {
              uVar22 = uVar22 + uVar6;
              rar->lastlowoffset = uVar6;
            }
          }
          else {
            rar->numlowoffsetrepeats = rar->numlowoffsetrepeats - 1;
            uVar22 = uVar22 + rar->lastlowoffset;
            end = local_118;
          }
        }
      }
      for (lVar19 = 0; lVar19 != -3; lVar19 = lVar19 + -1) {
        rar->oldoffset[lVar19 + 3] = rar->oldoffset[lVar19 + 2];
      }
      uVar6 = iVar18 + (uint)(0x3ffff < (int)uVar22) + (uint)(0x1fff < (int)uVar22);
    }
    rar->oldoffset[0] = uVar22;
  }
LAB_001484cc:
  rar->lastoffset = uVar22;
  rar->lastlength = uVar6;
  lzss_emit_match(rar,uVar22,uVar6);
  code = local_f0;
  goto LAB_0014807d;
}

Assistant:

static int64_t
expand(struct archive_read *a, int64_t end)
{
  static const unsigned char lengthbases[] =
    {   0,   1,   2,   3,   4,   5,   6,
        7,   8,  10,  12,  14,  16,  20,
       24,  28,  32,  40,  48,  56,  64,
       80,  96, 112, 128, 160, 192, 224 };
  static const unsigned char lengthbits[] =
    { 0, 0, 0, 0, 0, 0, 0,
      0, 1, 1, 1, 1, 2, 2,
      2, 2, 3, 3, 3, 3, 4,
      4, 4, 4, 5, 5, 5, 5 };
  static const int lengthb_min = minimum(
    (int)(sizeof(lengthbases)/sizeof(lengthbases[0])),
    (int)(sizeof(lengthbits)/sizeof(lengthbits[0]))
  );
  static const unsigned int offsetbases[] =
    {       0,       1,       2,       3,       4,       6,
            8,      12,      16,      24,      32,      48,
           64,      96,     128,     192,     256,     384,
          512,     768,    1024,    1536,    2048,    3072,
         4096,    6144,    8192,   12288,   16384,   24576,
        32768,   49152,   65536,   98304,  131072,  196608,
       262144,  327680,  393216,  458752,  524288,  589824,
       655360,  720896,  786432,  851968,  917504,  983040,
      1048576, 1310720, 1572864, 1835008, 2097152, 2359296,
      2621440, 2883584, 3145728, 3407872, 3670016, 3932160 };
  static const unsigned char offsetbits[] =
    {  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,
       5,  5,  6,  6,  7,  7,  8,  8,  9,  9, 10, 10,
      11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
      18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18 };
  static const int offsetb_min = minimum(
    (int)(sizeof(offsetbases)/sizeof(offsetbases[0])),
    (int)(sizeof(offsetbits)/sizeof(offsetbits[0]))
  );
  static const unsigned char shortbases[] =
    { 0, 4, 8, 16, 32, 64, 128, 192 };
  static const unsigned char shortbits[] =
    { 2, 2, 3, 4, 5, 6, 6, 6 };

  int symbol, offs, len, offsindex, lensymbol, i, offssymbol, lowoffsetsymbol;
  unsigned char newfile;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  if (rar->filters.filterstart < end)
    end = rar->filters.filterstart;

  while (1)
  {
    if(lzss_position(&rar->lzss) >= end)
      return end;

    if(rar->is_ppmd_block)
      return lzss_position(&rar->lzss);

    if ((symbol = read_next_symbol(a, &rar->maincode)) < 0)
      return (ARCHIVE_FATAL);

    if (symbol < 256)
    {
      lzss_emit_literal(rar, symbol);
      continue;
    }
    else if (symbol == 256)
    {
      if (!rar_br_read_ahead(a, br, 1))
        goto truncated_data;
      newfile = !rar_br_bits(br, 1);
      rar_br_consume(br, 1);

      if(newfile)
      {
        rar->start_new_block = 1;
        if (!rar_br_read_ahead(a, br, 1))
          goto truncated_data;
        rar->start_new_table = rar_br_bits(br, 1);
        rar_br_consume(br, 1);
        return lzss_position(&rar->lzss);
      }
      else
      {
        if (parse_codes(a) != ARCHIVE_OK)
          return (ARCHIVE_FATAL);
        continue;
      }
    }
    else if(symbol==257)
    {
      if (!read_filter(a, &end))
          return (ARCHIVE_FATAL);
      continue;
    }
    else if(symbol==258)
    {
      if(rar->lastlength == 0)
        continue;

      offs = rar->lastoffset;
      len = rar->lastlength;
    }
    else if (symbol <= 262)
    {
      offsindex = symbol - 259;
      offs = rar->oldoffset[offsindex];

      if ((lensymbol = read_next_symbol(a, &rar->lengthcode)) < 0)
        goto bad_data;
      if (lensymbol > lengthb_min)
        goto bad_data;
      len = lengthbases[lensymbol] + 2;
      if (lengthbits[lensymbol] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[lensymbol]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[lensymbol]);
        rar_br_consume(br, lengthbits[lensymbol]);
      }

      for (i = offsindex; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else if(symbol<=270)
    {
      offs = shortbases[symbol-263] + 1;
      if(shortbits[symbol-263] > 0) {
        if (!rar_br_read_ahead(a, br, shortbits[symbol-263]))
          goto truncated_data;
        offs += rar_br_bits(br, shortbits[symbol-263]);
        rar_br_consume(br, shortbits[symbol-263]);
      }

      len = 2;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else
    {
      if (symbol-271 > lengthb_min)
        goto bad_data;
      len = lengthbases[symbol-271]+3;
      if(lengthbits[symbol-271] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[symbol-271]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[symbol-271]);
        rar_br_consume(br, lengthbits[symbol-271]);
      }

      if ((offssymbol = read_next_symbol(a, &rar->offsetcode)) < 0)
        goto bad_data;
      if (offssymbol > offsetb_min)
        goto bad_data;
      offs = offsetbases[offssymbol]+1;
      if(offsetbits[offssymbol] > 0)
      {
        if(offssymbol > 9)
        {
          if(offsetbits[offssymbol] > 4) {
            if (!rar_br_read_ahead(a, br, offsetbits[offssymbol] - 4))
              goto truncated_data;
            offs += rar_br_bits(br, offsetbits[offssymbol] - 4) << 4;
            rar_br_consume(br, offsetbits[offssymbol] - 4);
          }

          if(rar->numlowoffsetrepeats > 0)
          {
            rar->numlowoffsetrepeats--;
            offs += rar->lastlowoffset;
          }
          else
          {
            if ((lowoffsetsymbol =
              read_next_symbol(a, &rar->lowoffsetcode)) < 0)
              return (ARCHIVE_FATAL);
            if(lowoffsetsymbol == 16)
            {
              rar->numlowoffsetrepeats = 15;
              offs += rar->lastlowoffset;
            }
            else
            {
              offs += lowoffsetsymbol;
              rar->lastlowoffset = lowoffsetsymbol;
            }
          }
        }
        else {
          if (!rar_br_read_ahead(a, br, offsetbits[offssymbol]))
            goto truncated_data;
          offs += rar_br_bits(br, offsetbits[offssymbol]);
          rar_br_consume(br, offsetbits[offssymbol]);
        }
      }

      if (offs >= 0x40000)
        len++;
      if (offs >= 0x2000)
        len++;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }

    rar->lastoffset = offs;
    rar->lastlength = len;

    lzss_emit_match(rar, rar->lastoffset, rar->lastlength);
  }
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
bad_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}